

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O1

bool __thiscall Fossilize::ApplicationInfoFilter::Impl::parse(Impl *this,char *path)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  bool bVar4;
  SizeType SVar5;
  int iVar6;
  FILE *__stream;
  size_type __n;
  size_t sVar7;
  Value *pVVar8;
  Ch *pCVar9;
  undefined8 uVar10;
  undefined8 *puVar11;
  MemoryStream ms;
  vector<char,_std::allocator<char>_> buffer;
  string json_str;
  Data local_d8;
  Ch *local_c8;
  long local_c0;
  Data local_b8;
  undefined8 *local_a8;
  undefined8 *puStack_a0;
  Stack<rapidjson::CrtAllocator> local_98;
  int local_68;
  undefined8 local_60;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  __stream = fopen(path,"rb");
  uVar10 = (Ch **)0x0;
  local_c8 = (Ch *)0x0;
  puVar11 = (undefined8 *)0x0;
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    if ((long)__n < 0) {
      fclose(__stream);
      uVar10 = (Ch **)0x0;
      local_c8 = (Ch *)0x0;
      puVar11 = (undefined8 *)0x0;
    }
    else {
      rewind(__stream);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&local_b8.s,__n,
                 (allocator_type *)&local_d8.s);
      sVar7 = fread((void *)local_b8.n,1,__n,__stream);
      fclose(__stream);
      puVar3 = local_a8;
      uVar2 = local_b8.s.str;
      uVar1 = local_b8.n;
      uVar10 = 0;
      puVar11 = (undefined8 *)0;
      local_c8 = (Ch *)0x0;
      if (sVar7 == __n) {
        local_b8.n.i64 = (Number)0x0;
        local_b8.s.str = (Ch *)0x0;
        local_a8 = (undefined8 *)0x0;
        uVar10 = uVar1;
        puVar11 = puVar3;
        local_c8 = (Ch *)uVar2;
      }
      if (local_b8.n.i64 != 0) {
        operator_delete((void *)local_b8.n,(long)local_a8 - local_b8._0_8_);
      }
    }
  }
  local_98.stack_ = (char *)0x0;
  local_98.stackTop_ = (char *)0x0;
  local_98.allocator_ = (CrtAllocator *)0x0;
  local_98.ownAllocator_ = (CrtAllocator *)0x0;
  local_a8 = (undefined8 *)0x0;
  puStack_a0 = (undefined8 *)0x0;
  local_b8.n = (Number)0x0;
  local_b8.s.str = (Ch *)0x0;
  bVar4 = false;
  local_98.stackEnd_ = (char *)0x0;
  local_98.initialCapacity_ = 0x400;
  local_68 = 0;
  local_60 = 0;
  local_a8 = (undefined8 *)operator_new(0x28);
  *local_a8 = 0;
  local_a8[1] = 0x10000;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[4] = 0;
  local_c0 = (long)local_c8 - uVar10;
  local_d8.n = (Number)uVar10;
  local_d8.s.str = (Ch *)uVar10;
  puStack_a0 = local_a8;
  rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::EncodedInputStream
            (&local_50,(MemoryStream *)&local_d8.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::
  ParseStream<0u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&local_b8.s,&local_50);
  if (local_68 != 0) goto LAB_00141b25;
  local_48 = 0;
  local_40 = 0;
  local_50.is_ = (MemoryStream *)&local_40;
  pVVar8 = get_safe_member((Value *)&local_b8.s,"asset");
  if ((pVVar8 == (Value *)0x0) ||
     ((undefined1  [16])((undefined1  [16])pVVar8->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0)) {
    parse();
LAB_00141b05:
    bVar4 = false;
  }
  else {
    pCVar9 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(pVVar8);
    SVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(pVVar8);
    local_d8.n = (Number)&local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,pCVar9,pCVar9 + SVar5);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d8.s);
    if (local_d8.n.i64 != (Number)&local_c8) {
      operator_delete((void *)local_d8.n,(ulong)(local_c8 + 1));
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar6 != 0) goto LAB_00141b05;
    pVVar8 = get_safe_member((Value *)&local_b8.s,"version");
    if ((pVVar8 == (Value *)0x0) ||
       ((undefined1  [16])((undefined1  [16])pVVar8->data_ & (undefined1  [16])0x20000000000000) ==
        (undefined1  [16])0x0)) {
      parse();
      goto LAB_00141b05;
    }
    if (2 < (int)(pVVar8->data_).s.length) goto LAB_00141b05;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_b8);
    if (local_b8.f.flags != 3) goto LAB_00141b64;
    if (local_d8.n.i64 !=
        (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 + ((ulong)local_b8.s.str & 0xffffffffffff))
       ) {
      bVar4 = add_blacklists(&this->blacklisted_application_names,(Value *)((long)local_d8.n + 0x10)
                            );
      if (!bVar4) goto LAB_00141b05;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_b8);
    if (local_b8.f.flags != 3) goto LAB_00141b64;
    if (local_d8.n.i64 !=
        (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 + ((ulong)local_b8.s.str & 0xffffffffffff))
       ) {
      bVar4 = add_blacklists(&this->blacklisted_engine_names,(Value *)((long)local_d8.n + 0x10));
      if (!bVar4) goto LAB_00141b05;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_b8);
    if (local_b8.f.flags != 3) goto LAB_00141b64;
    if (local_d8.n.i64 !=
        (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 + ((ulong)local_b8.s.str & 0xffffffffffff))
       ) {
      bVar4 = add_application_filters(&this->application_infos,(Value *)((long)local_d8.n + 0x10));
      if (!bVar4) goto LAB_00141b05;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_d8.s,(Ch *)&local_b8);
    if (local_b8.f.flags != 3) {
LAB_00141b64:
      __assert_fail("IsObject()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                    ,0x4db,
                    "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>>::MemberEnd() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
    if (local_d8.n.i64 !=
        (Number)(((ulong)local_b8.n & 0xffffffff) * 0x20 + ((ulong)local_b8.s.str & 0xffffffffffff))
       ) {
      bVar4 = add_application_filters(&this->engine_infos,(Value *)((long)local_d8.n + 0x10));
      if (!bVar4) goto LAB_00141b05;
    }
    pVVar8 = maybe_get_member((Value *)&local_b8.s,"defaultBucketVariantDependencies");
    if (pVVar8 != (Value *)0x0) {
      bVar4 = parse_bucket_variant_dependencies(pVVar8,&this->default_variant_dependencies);
      if (!bVar4) goto LAB_00141b05;
    }
    pVVar8 = maybe_get_member((Value *)&local_b8.s,"defaultBucketVariantFeatureDependencies");
    if (pVVar8 != (Value *)0x0) {
      bVar4 = parse_bucket_variant_dependencies(pVVar8,&this->default_variant_dependencies_feature);
      if (!bVar4) goto LAB_00141b05;
    }
    bVar4 = true;
  }
  if (local_50.is_ != (MemoryStream *)&local_40) {
    operator_delete(local_50.is_,CONCAT71(uStack_3f,local_40) + 1);
  }
LAB_00141b25:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Destroy((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             *)&local_b8.s);
  rapidjson::internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_98);
  if ((Ch **)uVar10 != (Ch **)0x0) {
    operator_delete((void *)uVar10,(long)puVar11 - uVar10);
  }
  return bVar4;
}

Assistant:

bool ApplicationInfoFilter::Impl::parse(const char *path)
{
	auto buffer = read_file(path);

	Document doc;
	doc.Parse(buffer.data(), buffer.size());
	if (doc.HasParseError())
		return false;

	std::string json_str;
	int json_int;

	if (!get_safe_member_string(doc, "asset", json_str) || json_str != "FossilizeApplicationInfoFilter")
		return false;

	if (!get_safe_member_int(doc, "version", json_int) || json_int > FOSSILIZE_APPLICATION_INFO_FILTER_VERSION)
		return false;

	auto *blacklist = maybe_get_member(doc, "blacklistedApplicationNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_application_names, blacklist))
			return false;
	blacklist = maybe_get_member(doc, "blacklistedEngineNames");
	if (blacklist)
		if (!add_blacklists(blacklisted_engine_names, blacklist))
			return false;

	auto *filters = maybe_get_member(doc, "applicationFilters");
	if (filters)
		if (!add_application_filters(application_infos, filters))
			return false;
	filters = maybe_get_member(doc, "engineFilters");
	if (filters)
		if (!add_application_filters(engine_infos, filters))
			return false;

	auto *default_variants = maybe_get_member(doc, "defaultBucketVariantDependencies");
	if (default_variants)
		if (!parse_bucket_variant_dependencies(*default_variants, default_variant_dependencies))
			return false;

	auto *default_feature_variants = maybe_get_member(doc, "defaultBucketVariantFeatureDependencies");
	if (default_feature_variants)
		if (!parse_bucket_variant_dependencies(*default_feature_variants, default_variant_dependencies_feature))
			return false;

	return true;
}